

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O0

void predict_iforest(float *numeric_data,int *categ_data,bool is_col_major,size_t ncols_numeric,
                    size_t ncols_categ,float *Xc,size_t *Xc_ind,size_t *Xc_indptr,float *Xr,
                    size_t *Xr_ind,size_t *Xr_indptr,size_t nrows,int nthreads,bool standardize,
                    IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *output_depths,
                    size_t *tree_num,double *per_tree_depths,TreesIndexer *indexer)

{
  bool in_stack_00000277;
  float *in_stack_00000278;
  size_t in_stack_00000280;
  size_t in_stack_00000288;
  bool in_stack_00000297;
  int *in_stack_00000298;
  float *in_stack_000002a0;
  unsigned_long *in_stack_000002b0;
  unsigned_long *in_stack_000002b8;
  float *in_stack_000002c0;
  unsigned_long *in_stack_000002c8;
  unsigned_long *in_stack_000002d0;
  size_t in_stack_000002d8;
  int in_stack_000002e0;
  IsoForest *in_stack_000002f0;
  ExtIsoForest *in_stack_000002f8;
  double *in_stack_00000300;
  unsigned_long *in_stack_00000308;
  double *in_stack_00000310;
  TreesIndexer *in_stack_00000318;
  
  predict_iforest<float,unsigned_long>
            (in_stack_000002a0,in_stack_00000298,in_stack_00000297,in_stack_00000288,
             in_stack_00000280,in_stack_00000278,in_stack_000002b0,in_stack_000002b8,
             in_stack_000002c0,in_stack_000002c8,in_stack_000002d0,in_stack_000002d8,
             in_stack_000002e0,in_stack_00000277,in_stack_000002f0,in_stack_000002f8,
             in_stack_00000300,in_stack_00000308,in_stack_00000310,in_stack_00000318);
  return;
}

Assistant:

ISOTREE_EXPORTED void predict_iforest(real_t numeric_data[], int categ_data[],
                     bool is_col_major, size_t ncols_numeric, size_t ncols_categ,
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double output_depths[],   sparse_ix tree_num[],
                     double per_tree_depths[],
                     TreesIndexer *indexer)
{
    predict_iforest<real_t, sparse_ix>
                    (numeric_data, categ_data,
                     is_col_major, ncols_numeric, ncols_categ,
                     Xc, Xc_ind, Xc_indptr,
                     Xr, Xr_ind, Xr_indptr,
                     nrows, nthreads, standardize,
                     model_outputs, model_outputs_ext,
                     output_depths,   tree_num,
                     per_tree_depths,
                     indexer);
}